

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

string * __thiscall Config::GetValue_abi_cxx11_(Config *this,char *key)

{
  bool bVar1;
  Type this_00;
  char *in_RDX;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RSI;
  string *in_RDI;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffffa0;
  Ch *in_stack_ffffffffffffffa8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffffb0;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  int __val;
  
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (bVar1) {
    this_00 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(in_RSI,in_RDX);
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsString(this_00);
    if (bVar1) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
      operator[]<char_const>(in_RSI,in_RDX);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GetString(in_stack_ffffffffffffffa0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe7);
    }
    else {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
      operator[]<char_const>(in_RSI,in_RDX);
      __val = (int)((ulong)in_RDX >> 0x20);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GetInt(in_stack_ffffffffffffffa0);
      std::__cxx11::to_string(__val);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd3);
  }
  return in_RDI;
}

Assistant:

std::string Config::GetValue(const char* key)
{
    if(Settings.HasMember(key))
    {
        if(Settings[key].IsString())
        {
            return Settings[key].GetString();
        }
        else
        {
            return std::to_string(Settings[key].GetInt());
        }
        
    }

    return nullptr;
}